

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O0

ostream * std::operator<<(ostream *os,double2 *v)

{
  ostream *poVar1;
  const_reference pvVar2;
  _anonymous_namespace_ *p_Var3;
  string local_58;
  string local_38;
  array<double,_2UL> *local_18;
  double2 *v_local;
  ostream *os_local;
  
  local_18 = v;
  v_local = (double2 *)os;
  poVar1 = std::operator<<(os,"(");
  p_Var3 = (_anonymous_namespace_ *)0x0;
  pvVar2 = array<double,_2UL>::operator[](local_18,0);
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_38,p_Var3,*pvVar2);
  poVar1 = std::operator<<(poVar1,(string *)&local_38);
  poVar1 = std::operator<<(poVar1,", ");
  p_Var3 = (_anonymous_namespace_ *)0x1;
  pvVar2 = array<double,_2UL>::operator[](local_18,1);
  tinyusdz::(anonymous_namespace)::dtos_abi_cxx11_(&local_58,p_Var3,*pvVar2);
  poVar1 = std::operator<<(poVar1,(string *)&local_58);
  std::operator<<(poVar1,")");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return (ostream *)v_local;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const tinyusdz::value::double2 &v) {
  os << "(" << tinyusdz::dtos(v[0]) << ", " << tinyusdz::dtos(v[1]) << ")";
  return os;
}